

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  reference pvVar5;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_R8;
  double dVar6;
  double QnSP_pT_local;
  int j;
  double Q2_local;
  int i;
  undefined4 local_3c;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x1c8); local_2c = local_2c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_2c);
    dVar6 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_2c);
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_2c);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_2c);
    dVar3 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    dVar6 = (dVar6 * dVar1 + dVar2 * dVar3) - *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 1000),(long)local_2c);
    *pvVar4 = dVar6 + *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x400),(long)local_2c);
    *pvVar4 = dVar6 * dVar6 + *pvVar4;
    for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x1d0); local_3c = local_3c + 1) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RCX,(long)local_2c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
      dVar6 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_2c);
      dVar1 = *pvVar4;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_R8,(long)local_2c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
      dVar2 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_2c);
      dVar3 = *pvVar4;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RCX,0);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
      dVar6 = (dVar6 * dVar1 + dVar2 * dVar3) - *pvVar4;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x418),(long)local_2c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
      *pvVar4 = dVar6 + *pvVar4;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x430),(long)local_2c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_3c);
      *pvVar4 = dVar6 * dVar6 + *pvVar4;
    }
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation(
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_imag) {
    for (int i = 0; i < order_max; i++) {
        double Q2_local =
            (event_Qn_real[i] * event_Qn_real[i]
             + event_Qn_imag[i] * event_Qn_imag[i] - event_Qn_real[0]);
        Qn2_vector[i] += Q2_local;
        Qn2_vector_err[i] += Q2_local * Q2_local;
        for (int j = 0; j < npT; j++) {
            double QnSP_pT_local =
                (event_Qn_diff_real[i][j] * event_Qn_real[i]
                 + event_Qn_diff_imag[i][j] * event_Qn_imag[i]
                 - event_Qn_diff_real[0][j]);
            QnSP_diff_vector[i][j] += QnSP_pT_local;
            QnSP_diff_vector_err[i][j] += QnSP_pT_local * QnSP_pT_local;
        }
    }
}